

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

int wc_match_fragment(char **fragment,char **target,char *target_end)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  bool bVar8;
  byte bVar9;
  
  pbVar6 = (byte *)*fragment;
  pbVar5 = (byte *)*target;
LAB_00121d04:
  bVar9 = *pbVar6;
  if ((bVar9 != 0) && (bVar9 != 0x2a)) {
    if (pbVar5 < target_end) {
      if (bVar9 == 0x3f) goto LAB_00121e0b;
      if (bVar9 == 0x5b) {
        pbVar1 = pbVar6 + 1;
        pbVar2 = pbVar6 + 1;
        pbVar6 = pbVar6 + 2;
        if (*pbVar2 != 0x5e) {
          pbVar6 = pbVar1;
        }
        bVar8 = false;
LAB_00121d6f:
        bVar9 = *pbVar6;
        if (bVar9 == 0x5c) {
          bVar9 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        }
        else if (bVar9 == 0x5d) goto LAB_00121e16;
        if (bVar9 == 0) {
          return -2;
        }
        if (pbVar6[1] == 0x2d) {
          bVar3 = pbVar6[2];
          if (bVar3 == 0x5c) {
            bVar3 = pbVar6[3];
            lVar7 = 3;
          }
          else {
            lVar7 = 2;
            if (bVar3 == 0x5d) {
              return -3;
            }
          }
          if (bVar3 == 0) {
            return -2;
          }
          bVar4 = bVar3;
          if (bVar9 < bVar3) {
            bVar4 = bVar9;
          }
          pbVar6 = pbVar6 + lVar7 + 1;
          if (bVar3 < bVar9) {
            bVar3 = bVar9;
          }
          bVar8 = (bool)(bVar8 | (*pbVar5 <= bVar3 && bVar4 <= *pbVar5));
        }
        else {
          pbVar6 = pbVar6 + 1;
          bVar8 = (bool)(bVar8 | *pbVar5 == bVar9);
        }
        goto LAB_00121d6f;
      }
      if (bVar9 != 0x5c) {
        if (bVar9 != *pbVar5) {
          return 0;
        }
        goto LAB_00121e0b;
      }
      if (pbVar6[1] == 0) {
        return -1;
      }
      if (pbVar6[1] != *pbVar5) {
        return 0;
      }
      pbVar6 = pbVar6 + 2;
      goto LAB_00121e0e;
    }
    if (bVar9 != 0) {
      return 0;
    }
  }
  *fragment = (char *)pbVar6;
  *target = (char *)pbVar5;
  return 1;
LAB_00121e16:
  if ((*pbVar2 == 0x5e) == bVar8) {
    return 0;
  }
LAB_00121e0b:
  pbVar6 = pbVar6 + 1;
LAB_00121e0e:
  pbVar5 = pbVar5 + 1;
  goto LAB_00121d04;
}

Assistant:

static int wc_match_fragment(const char **fragment, const char **target,
                             const char *target_end)
{
    const char *f, *t;

    f = *fragment;
    t = *target;
    /*
     * The fragment terminates at either the end of the string, or
     * the first (unescaped) *.
     */
    while (*f && *f != '*' && t < target_end) {
        /*
         * Extract one character from t, and one character's worth
         * of pattern from f, and step along both. Return 0 if they
         * fail to match.
         */
        if (*f == '\\') {
            /*
             * Backslash, which means f[1] is to be treated as a
             * literal character no matter what it is. It may not
             * be the end of the string.
             */
            if (!f[1])
                return -WC_TRAILINGBACKSLASH;   /* error */
            if (f[1] != *t)
                return 0;              /* failed to match */
            f += 2;
        } else if (*f == '?') {
            /*
             * Question mark matches anything.
             */
            f++;
        } else if (*f == '[') {
            bool invert = false;
            bool matched = false;
            /*
             * Open bracket introduces a character class.
             */
            f++;
            if (*f == '^') {
                invert = true;
                f++;
            }
            while (*f != ']') {
                if (*f == '\\')
                    f++;               /* backslashes still work */
                if (!*f)
                    return -WC_UNCLOSEDCLASS;   /* error again */
                if (f[1] == '-') {
                    int lower, upper, ourchr;
                    lower = (unsigned char) *f++;
                    f++;               /* eat the minus */
                    if (*f == ']')
                        return -WC_INVALIDRANGE;   /* different error! */
                    if (*f == '\\')
                        f++;           /* backslashes _still_ work */
                    if (!*f)
                        return -WC_UNCLOSEDCLASS;   /* error again */
                    upper = (unsigned char) *f++;
                    ourchr = (unsigned char) *t;
                    if (lower > upper) {
                        int t = lower; lower = upper; upper = t;
                    }
                    if (ourchr >= lower && ourchr <= upper)
                        matched = true;
                } else {
                    matched |= (*t == *f++);
                }
            }
            if (invert == matched)
                return 0;              /* failed to match character class */
            f++;                       /* eat the ] */
        } else {
            /*
             * Non-special character matches itself.
             */
            if (*f != *t)
                return 0;
            f++;
        }
        /*
         * Now we've done that, increment t past the character we
         * matched.
         */
        t++;
    }
    if (!*f || *f == '*') {
        /*
         * We have reached the end of f without finding a mismatch;
         * so we're done. Update the caller pointers and return 1.
         */
        *fragment = f;
        *target = t;
        return 1;
    }
    /*
     * Otherwise, we must have reached the end of t before we
     * reached the end of f; so we've failed. Return 0.
     */
    return 0;
}